

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cport.cc
# Opt level: O0

shared_ptr<GenApi_3_4::CNodeMapRef>
rcg::allocNodeMap(shared_ptr<const_rcg::GenTLWrapper> *gentl,void *port,CPort *cport,char *xml)

{
  PGCReadPort p_Var1;
  unsigned_long_long uVar2;
  PORT_HANDLE pvVar3;
  bool bVar4;
  GC_ERROR GVar5;
  _Ios_Openmode _Var6;
  GC_ERROR GVar7;
  int iVar8;
  uint uVar9;
  element_type *peVar10;
  undefined8 uVar11;
  pointer pcVar12;
  ulong uVar13;
  char *pcVar14;
  element_type *peVar15;
  GenTLException *this;
  undefined8 in_RCX;
  PORT_HANDLE in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  char *in_R8;
  shared_ptr<GenApi_3_4::CNodeMapRef> sVar16;
  GenericException *ex;
  gcstring portname;
  gcstring file_1;
  gcstring file;
  string name_1;
  size_t i_1;
  gcstring sxml;
  ofstream out;
  unique_ptr<char[],_std::default_delete<char[]>_> buffer;
  size_t length;
  uint64_t address;
  string slength;
  string saddress;
  string name;
  stringstream in;
  size_t i;
  string url;
  size_t size;
  char tmp [1024];
  INFO_DATATYPE type;
  uint32_t n;
  shared_ptr<GenApi_3_4::CNodeMapRef> nodemap;
  gcstring *in_stack_fffffffffffff1f8;
  string *in_stack_fffffffffffff200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff208;
  string *in_stack_fffffffffffff218;
  allocator *paVar17;
  GenTLException *in_stack_fffffffffffff220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff240;
  undefined4 in_stack_fffffffffffff248;
  undefined4 in_stack_fffffffffffff24c;
  bool local_d81;
  bool local_d59;
  gcstring *in_stack_fffffffffffff2f8;
  CNodeMapRefT<GenApi_3_4::CGeneric_XMLLoaderParams> *in_stack_fffffffffffff300;
  string *this_00;
  undefined4 in_stack_fffffffffffff308;
  undefined4 in_stack_fffffffffffff314;
  undefined4 in_stack_fffffffffffff340;
  gcstring *in_stack_fffffffffffff348;
  CNodeMapRefT<GenApi_3_4::CGeneric_XMLLoaderParams> *in_stack_fffffffffffff350;
  size_t in_stack_fffffffffffff3a8;
  undefined5 in_stack_fffffffffffff3b0;
  undefined1 in_stack_fffffffffffff3b5;
  undefined2 in_stack_fffffffffffff3b6;
  string *in_stack_fffffffffffff3b8;
  string local_c08 [32];
  gcstring local_be8 [86];
  undefined1 local_b92;
  allocator local_b91;
  string local_b90 [38];
  undefined1 local_b6a;
  allocator local_b69 [33];
  string local_b48 [32];
  gcstring local_b28 [80];
  gcstring local_ad8 [87];
  byte local_a81;
  string local_a80 [32];
  string local_a60 [32];
  long local_a40;
  string local_a38 [32];
  gcstring local_a18 [87];
  byte local_9c1;
  string local_9c0 [32];
  undefined1 local_9a0 [432];
  shared_ptr<const_rcg::GenTLWrapper> *in_stack_fffffffffffff810;
  string *in_stack_fffffffffffff818;
  GenTLException *in_stack_fffffffffffff820;
  allocator local_799;
  string local_798 [40];
  unsigned_long_long local_770;
  unsigned_long_long local_768;
  string local_760 [32];
  string local_740 [32];
  string local_720 [32];
  string local_700 [32];
  stringstream local_6e0 [392];
  long local_558;
  string local_550 [39];
  allocator local_529;
  string local_528 [38];
  undefined1 local_502;
  allocator local_501;
  string local_500 [32];
  size_t local_4e0;
  char local_4d8 [1036];
  INFO_DATATYPE local_cc [2];
  undefined1 local_c2;
  allocator local_c1;
  string local_c0 [36];
  uint32_t local_9c;
  undefined1 local_95;
  gcstring local_88 [96];
  char *local_28;
  undefined8 local_20;
  PORT_HANDLE local_18;
  
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  operator_new(0x68);
  local_95 = 1;
  GenICam_3_4::gcstring::gcstring(local_88,"Device");
  GenApi_3_4::CNodeMapRef::CNodeMapRef
            ((CNodeMapRef *)in_stack_fffffffffffff200,in_stack_fffffffffffff1f8);
  local_95 = 0;
  std::shared_ptr<GenApi_3_4::CNodeMapRef>::shared_ptr<GenApi_3_4::CNodeMapRef,void>
            ((shared_ptr<GenApi_3_4::CNodeMapRef> *)in_stack_fffffffffffff200,
             (CNodeMapRef *)in_stack_fffffffffffff1f8);
  GenICam_3_4::gcstring::~gcstring(local_88);
  local_9c = 0;
  peVar10 = std::
            __shared_ptr_access<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x152ee5);
  GVar5 = (*peVar10->GCGetNumPortURLs)(local_18,&local_9c);
  if (GVar5 != 0) {
    local_c2 = 1;
    uVar11 = __cxa_allocate_exception(0x28);
    paVar17 = &local_c1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_c0,"allocNodeMap()",paVar17);
    GenTLException::GenTLException
              (in_stack_fffffffffffff820,in_stack_fffffffffffff818,in_stack_fffffffffffff810);
    local_c2 = 0;
    __cxa_throw(uVar11,&GenTLException::typeinfo,GenTLException::~GenTLException);
  }
  if (local_9c == 0) {
    std::shared_ptr<GenApi_3_4::CNodeMapRef>::shared_ptr
              ((shared_ptr<GenApi_3_4::CNodeMapRef> *)0x153092);
  }
  else {
    memset(local_4d8,0,0x400);
    local_4e0 = 0x400;
    peVar10 = std::
              __shared_ptr_access<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x1530de);
    GVar5 = (*peVar10->GCGetPortURLInfo)(local_18,0,0,local_cc,local_4d8,&local_4e0);
    if (GVar5 != 0) {
      local_502 = 1;
      uVar11 = __cxa_allocate_exception(0x28);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_500,"allocNodeMap()",&local_501);
      GenTLException::GenTLException
                (in_stack_fffffffffffff820,in_stack_fffffffffffff818,in_stack_fffffffffffff810);
      local_502 = 0;
      __cxa_throw(uVar11,&GenTLException::typeinfo,GenTLException::~GenTLException);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_528,local_4d8,&local_529);
    std::allocator<char>::~allocator((allocator<char> *)&local_529);
    anon_unknown_4::toLower
              (in_stack_fffffffffffff3b8,
               CONCAT26(in_stack_fffffffffffff3b6,
                        CONCAT15(in_stack_fffffffffffff3b5,in_stack_fffffffffffff3b0)),
               in_stack_fffffffffffff3a8);
    bVar4 = std::operator==(in_stack_fffffffffffff200,(char *)in_stack_fffffffffffff1f8);
    uVar9 = CONCAT13(bVar4,(int3)in_stack_fffffffffffff314);
    std::__cxx11::string::~string(local_550);
    if ((uVar9 & 0x1000000) == 0) {
      anon_unknown_4::toLower
                (in_stack_fffffffffffff3b8,
                 CONCAT26(in_stack_fffffffffffff3b6,
                          CONCAT15(in_stack_fffffffffffff3b5,in_stack_fffffffffffff3b0)),
                 in_stack_fffffffffffff3a8);
      bVar4 = std::operator==(in_stack_fffffffffffff200,(char *)in_stack_fffffffffffff1f8);
      std::__cxx11::string::~string(local_a38);
      if (!bVar4) {
        local_b6a = 1;
        uVar11 = __cxa_allocate_exception(0x28);
        std::operator+((char *)CONCAT44(in_stack_fffffffffffff24c,in_stack_fffffffffffff248),
                       in_stack_fffffffffffff240);
        pcVar14 = (char *)std::__cxx11::string::c_str();
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_b48,pcVar14,local_b69);
        GenTLException::GenTLException(in_stack_fffffffffffff220,in_stack_fffffffffffff218);
        local_b6a = 0;
        __cxa_throw(uVar11,&GenTLException::typeinfo,GenTLException::~GenTLException);
      }
      local_a40 = 5;
      iVar8 = std::__cxx11::string::compare((ulong)local_528,5,(char *)0x3);
      if (iVar8 == 0) {
        local_a40 = local_a40 + 3;
      }
      std::__cxx11::string::substr((ulong)local_a60,(ulong)local_528);
      uVar13 = std::__cxx11::string::size();
      local_a81 = 0;
      local_d81 = false;
      if (4 < uVar13) {
        std::__cxx11::string::size();
        anon_unknown_4::toLower
                  (in_stack_fffffffffffff3b8,
                   CONCAT26(in_stack_fffffffffffff3b6,
                            CONCAT15(in_stack_fffffffffffff3b5,in_stack_fffffffffffff3b0)),
                   in_stack_fffffffffffff3a8);
        local_a81 = 1;
        local_d81 = std::operator==(in_stack_fffffffffffff200,(char *)in_stack_fffffffffffff1f8);
      }
      if ((local_a81 & 1) != 0) {
        std::__cxx11::string::~string(local_a80);
      }
      if (local_d81 == false) {
        pcVar14 = (char *)std::__cxx11::string::c_str();
        GenICam_3_4::gcstring::gcstring(local_b28,pcVar14);
        std::__shared_ptr_access<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x153c83);
        GenApi_3_4::CNodeMapRefT<GenApi_3_4::CGeneric_XMLLoaderParams>::_LoadXMLFromFile
                  (in_stack_fffffffffffff300,in_stack_fffffffffffff2f8);
        GenICam_3_4::gcstring::~gcstring(local_b28);
      }
      else {
        pcVar14 = (char *)std::__cxx11::string::c_str();
        GenICam_3_4::gcstring::gcstring(local_ad8,pcVar14);
        std::__shared_ptr_access<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x153bc2);
        GenApi_3_4::CNodeMapRefT<GenApi_3_4::CGeneric_XMLLoaderParams>::_LoadXMLFromZIPFile
                  (in_stack_fffffffffffff350,in_stack_fffffffffffff348);
        GenICam_3_4::gcstring::~gcstring(local_ad8);
      }
      std::__cxx11::string::~string(local_a60);
    }
    else {
      local_558 = 6;
      iVar8 = std::__cxx11::string::compare((ulong)local_528,6,(char *)0x3);
      if (iVar8 == 0) {
        local_558 = local_558 + 3;
      }
      std::__cxx11::string::substr((ulong)local_700,(ulong)local_528);
      _Var6 = std::operator|(_S_out,_S_in);
      std::__cxx11::stringstream::stringstream(local_6e0,local_700,_Var6);
      std::__cxx11::string::~string(local_700);
      this_00 = local_720;
      std::__cxx11::string::string(this_00);
      std::__cxx11::string::string(local_740);
      std::__cxx11::string::string(local_760);
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)local_6e0,this_00,';');
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)local_6e0,local_740,';');
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)local_6e0,local_760,';');
      local_768 = std::__cxx11::stoull
                            (in_stack_fffffffffffff200,(size_t *)in_stack_fffffffffffff1f8,0);
      local_770 = std::__cxx11::stoull
                            (in_stack_fffffffffffff200,(size_t *)in_stack_fffffffffffff1f8,0);
      operator_new__(local_770 + 1);
      std::unique_ptr<char[],std::default_delete<char[]>>::
      unique_ptr<char*,std::default_delete<char[]>,void,bool>
                ((unique_ptr<char[],_std::default_delete<char[]>_> *)in_stack_fffffffffffff200,
                 (char *)in_stack_fffffffffffff1f8);
      peVar10 = std::
                __shared_ptr_access<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)0x153507);
      pvVar3 = local_18;
      uVar2 = local_768;
      p_Var1 = peVar10->GCReadPort;
      pcVar12 = std::unique_ptr<char[],_std::default_delete<char[]>_>::get
                          ((unique_ptr<char[],_std::default_delete<char[]>_> *)
                           in_stack_fffffffffffff200);
      GVar7 = (*p_Var1)(pvVar3,uVar2,pcVar12,&local_770);
      if (GVar7 != 0) {
        uVar11 = __cxa_allocate_exception(0x28);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_798,"allocNodeMap()",&local_799);
        GenTLException::GenTLException
                  (in_stack_fffffffffffff820,in_stack_fffffffffffff818,in_stack_fffffffffffff810);
        __cxa_throw(uVar11,&GenTLException::typeinfo,GenTLException::~GenTLException);
      }
      pcVar12 = std::unique_ptr<char[],_std::default_delete<char[]>_>::get
                          ((unique_ptr<char[],_std::default_delete<char[]>_> *)
                           in_stack_fffffffffffff200);
      pcVar12[local_770] = '\0';
      if (local_28 != (char *)0x0) {
        if (*local_28 == '\0') {
          local_28 = (char *)std::__cxx11::string::c_str();
        }
        std::ofstream::ofstream(local_9a0,local_28,_S_bin);
        pcVar14 = (char *)std::ofstream::rdbuf();
        pcVar12 = std::unique_ptr<char[],_std::default_delete<char[]>_>::get
                            ((unique_ptr<char[],_std::default_delete<char[]>_> *)
                             in_stack_fffffffffffff200);
        std::streambuf::sputn(pcVar14,(long)pcVar12);
        std::ofstream::~ofstream(local_9a0);
      }
      uVar13 = std::__cxx11::string::size();
      local_9c1 = 0;
      local_d59 = false;
      if (4 < uVar13) {
        std::__cxx11::string::size();
        anon_unknown_4::toLower
                  (in_stack_fffffffffffff3b8,
                   CONCAT26(in_stack_fffffffffffff3b6,
                            CONCAT15(in_stack_fffffffffffff3b5,in_stack_fffffffffffff3b0)),
                   in_stack_fffffffffffff3a8);
        local_9c1 = 1;
        local_d59 = std::operator==(in_stack_fffffffffffff200,(char *)in_stack_fffffffffffff1f8);
      }
      if ((local_9c1 & 1) != 0) {
        std::__cxx11::string::~string(local_9c0);
      }
      if (local_d59 == false) {
        pcVar12 = std::unique_ptr<char[],_std::default_delete<char[]>_>::get
                            ((unique_ptr<char[],_std::default_delete<char[]>_> *)
                             in_stack_fffffffffffff200);
        GenICam_3_4::gcstring::gcstring(local_a18,pcVar12);
        std::__shared_ptr_access<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x15390f);
        GenApi_3_4::CNodeMapRefT<GenApi_3_4::CGeneric_XMLLoaderParams>::_LoadXMLFromString
                  ((CNodeMapRefT<GenApi_3_4::CGeneric_XMLLoaderParams> *)CONCAT44(uVar9,iVar8),
                   (gcstring *)CONCAT44(_Var6,in_stack_fffffffffffff308));
        GenICam_3_4::gcstring::~gcstring(local_a18);
      }
      else {
        std::__shared_ptr_access<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x15387d);
        std::unique_ptr<char[],_std::default_delete<char[]>_>::get
                  ((unique_ptr<char[],_std::default_delete<char[]>_> *)in_stack_fffffffffffff200);
        GenApi_3_4::CNodeMapRefT<GenApi_3_4::CGeneric_XMLLoaderParams>::_LoadXMLFromZIPData
                  (in_stack_fffffffffffff350,in_stack_fffffffffffff348,
                   CONCAT44(GVar5,in_stack_fffffffffffff340));
      }
      std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr
                ((unique_ptr<char[],_std::default_delete<char[]>_> *)in_stack_fffffffffffff200);
      std::__cxx11::string::~string(local_760);
      std::__cxx11::string::~string(local_740);
      std::__cxx11::string::~string(local_720);
      std::__cxx11::stringstream::~stringstream(local_6e0);
    }
    local_4e0 = 0x400;
    peVar10 = std::
              __shared_ptr_access<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x153e33);
    GVar5 = (*peVar10->GCGetPortInfo)(local_18,0xc,local_cc,local_4d8,&local_4e0);
    if (GVar5 != 0) {
      local_b92 = 1;
      uVar11 = __cxa_allocate_exception(0x28);
      paVar17 = &local_b91;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_b90,"allocNodeMap()",paVar17);
      GenTLException::GenTLException
                (in_stack_fffffffffffff820,in_stack_fffffffffffff818,in_stack_fffffffffffff810);
      local_b92 = 0;
      __cxa_throw(uVar11,&GenTLException::typeinfo,GenTLException::~GenTLException);
    }
    GenICam_3_4::gcstring::gcstring(local_be8,local_4d8);
    peVar15 = std::
              __shared_ptr_access<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x153f79);
    uVar9 = (*(peVar15->super_CNodeMapRefT<GenApi_3_4::CGeneric_XMLLoaderParams>).
              super_CGeneric_XMLLoaderParams._vptr_CGeneric_XMLLoaderParams[0xc])
                      (peVar15,local_20,local_be8);
    if ((uVar9 & 1) == 0) {
      this = (GenTLException *)__cxa_allocate_exception(0x28);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&stack0xfffffffffffff3b8,"allocNodeMap(): Cannot connect port: ",
                 (allocator *)&stack0xfffffffffffff3b7);
      std::operator+(in_stack_fffffffffffff208,(char *)in_stack_fffffffffffff200);
      pcVar14 = (char *)std::__cxx11::string::c_str();
      paVar17 = (allocator *)&stack0xfffffffffffff3b6;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_c08,pcVar14,paVar17);
      GenTLException::GenTLException(this,(string *)paVar17);
      __cxa_throw(this,&GenTLException::typeinfo,GenTLException::~GenTLException);
    }
    GenICam_3_4::gcstring::~gcstring(local_be8);
    std::__cxx11::string::~string(local_528);
    std::shared_ptr<GenApi_3_4::CNodeMapRef>::shared_ptr
              ((shared_ptr<GenApi_3_4::CNodeMapRef> *)in_stack_fffffffffffff200,
               (shared_ptr<GenApi_3_4::CNodeMapRef> *)in_stack_fffffffffffff1f8);
  }
  local_cc[1] = 1;
  std::shared_ptr<GenApi_3_4::CNodeMapRef>::~shared_ptr
            ((shared_ptr<GenApi_3_4::CNodeMapRef> *)0x1542c9);
  sVar16.super___shared_ptr<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar16.super___shared_ptr<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (shared_ptr<GenApi_3_4::CNodeMapRef>)
         sVar16.super___shared_ptr<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<GenApi::CNodeMapRef> allocNodeMap(std::shared_ptr<const GenTLWrapper> gentl,
                                                  void *port, CPort *cport, const char *xml)
{
  std::shared_ptr<GenApi::CNodeMapRef> nodemap(new GenApi::CNodeMapRef());

  try
  {
    // get number of URLS that the given port provides

    uint32_t n=0;
    if (gentl->GCGetNumPortURLs(port, &n) != GenTL::GC_ERR_SUCCESS)
    {
      throw GenTLException("allocNodeMap()", gentl);
    }

    if (n == 0)
    {
      return std::shared_ptr<GenApi::CNodeMapRef>();
    }

    // get the first URL

    GenTL::INFO_DATATYPE type;
    char tmp[1024]="";
    size_t size=sizeof(tmp);

    if (gentl->GCGetPortURLInfo(port, 0, GenTL::URL_INFO_URL, &type, tmp, &size) !=
        GenTL::GC_ERR_SUCCESS)
    {
      throw GenTLException("allocNodeMap()", gentl);
    }

    // interpret the URL and load XML File

    std::string url=tmp;
    if (toLower(url, 0, 6) == "local:")
    {
      // interpret local URL

      size_t i=6;
      if (url.compare(i, 3, "///") == 0)
      {
        i+=3;
      }

      std::stringstream in(url.substr(i));
      std::string name, saddress, slength;

      std::getline(in, name, ';');
      std::getline(in, saddress, ';');
      std::getline(in, slength, ';');

      uint64_t address=std::stoull(saddress, 0, 16);
      size_t length=static_cast<size_t>(std::stoull(slength, 0, 16));

      // read XML or ZIP from registers

      std::unique_ptr<char[]> buffer(new char[length+1]);

      if (gentl->GCReadPort(port, address, buffer.get(), &length) != GenTL::GC_ERR_SUCCESS)
      {
        throw GenTLException("allocNodeMap()", gentl);
      }

      buffer.get()[length]='\0';

      // store XML file

      if (xml != 0)
      {
        if (xml[0] == '\0')
        {
          xml=name.c_str();
        }

        std::ofstream out(xml, std::ios::binary);

        out.rdbuf()->sputn(buffer.get(), static_cast<std::streamsize>(length));
      }

      // load XML or ZIP from registers

      if (name.size() > 4 && toLower(name, name.size()-4, 4) == ".zip")
      {
        nodemap->_LoadXMLFromZIPData(buffer.get(), length);
      }
      else
      {
        GENICAM_NAMESPACE::gcstring sxml=buffer.get();
        nodemap->_LoadXMLFromString(sxml);
      }
    }
    else if (toLower(url, 0, 5) == "file:")
    {
      // interpret local URL

      size_t i=5;
      if (url.compare(i, 3, "///") == 0)
      {
        i+=3;
      }

      std::string name=url.substr(i);

      // load XML or ZIP from file

      if (name.size() > 4 && toLower(name, name.size()-4, 4) == ".zip")
      {
        GENICAM_NAMESPACE::gcstring file=name.c_str();
        nodemap->_LoadXMLFromZIPFile(file);
      }
      else
      {
        GENICAM_NAMESPACE::gcstring file=name.c_str();
        nodemap->_LoadXMLFromFile(file);
      }
    }
    else
    {
      throw GenTLException(("allocNodeMap(): Cannot interpret URL: "+url).c_str());
    }

    // get port name

    size=sizeof(tmp);

    if (gentl->GCGetPortInfo(port, GenTL::PORT_INFO_PORTNAME, &type, tmp, &size) !=
        GenTL::GC_ERR_SUCCESS)
    {
      throw GenTLException("allocNodeMap()", gentl);
    }

    GENICAM_NAMESPACE::gcstring portname=tmp;
    if (!nodemap->_Connect(cport, portname))
    {
      throw GenTLException((std::string("allocNodeMap(): Cannot connect port: ")+tmp).c_str());
    }
  }
  catch (const GENICAM_NAMESPACE::GenericException &ex)
  {
    throw GenTLException(ex.what());
  }

  return nodemap;
}